

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

void __thiscall
Inline::SetupInlineInstrForCallDirect
          (Inline *this,BuiltinFunction builtInId,Instr *callInstr,Instr *argoutInstr)

{
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  HelperCallOpnd *this_00;
  undefined4 *puVar4;
  Opnd *this_01;
  Func *pFVar5;
  JnHelperMethod fnHelper;
  
  switch(builtInId._value) {
  case '\x06':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_At;
    break;
  default:
    goto switchD_0054e2ca_caseD_7;
  case '\b':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_CharAt;
    break;
  case '\t':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_CharCodeAt;
    break;
  case '\n':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_Concat;
    break;
  case '\v':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_FromCharCode;
    break;
  case '\f':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_FromCodePoint;
    break;
  case '\r':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_IndexOf;
    break;
  case '\x0e':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_LastIndexOf;
    break;
  case '\x0f':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_Link;
    break;
  case '\x10':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_Match;
    break;
  case '\x11':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_Replace;
    break;
  case '\x12':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_Search;
    break;
  case '\x13':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_Slice;
    break;
  case '\x14':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_Split;
    break;
  case '\x15':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_Substr;
    break;
  case '\x16':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_Substring;
    break;
  case '\x17':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_ToLocaleLowerCase;
    break;
  case '\x18':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_ToLocaleUpperCase;
    break;
  case '\x19':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_ToLowerCase;
    break;
  case '\x1a':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_ToUpperCase;
    break;
  case '\x1b':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_Trim;
    break;
  case '\x1c':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_TrimLeft;
    break;
  case '\x1e':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_TrimRight;
    break;
  case '0':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperArray_At;
    break;
  case '1':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperArray_Concat;
    break;
  case '2':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperArray_IndexOf;
    break;
  case '3':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperArray_Includes;
    break;
  case '4':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperArray_IsArray;
    break;
  case '5':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperArray_Join;
    break;
  case '6':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperArray_LastIndexOf;
    break;
  case '7':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperArray_Reverse;
    break;
  case '8':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperArray_Shift;
    break;
  case '9':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperArray_Slice;
    break;
  case ':':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperArray_Splice;
    break;
  case ';':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperArray_Unshift;
    break;
  case '?':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperGlobalObject_ParseInt;
    break;
  case '@':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperRegExp_Exec;
    break;
  case 'A':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperRegExp_SymbolSearch;
    break;
  case 'C':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_PadStart;
    break;
  case 'D':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperString_PadEnd;
    break;
  case 'E':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperObject_HasOwnProperty;
    break;
  case 'F':
    pFVar5 = callInstr->m_func;
    fnHelper = HelperObject_HasOwn;
  }
  this_00 = IR::HelperCallOpnd::New(fnHelper,pFVar5);
  if (callInstr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0054e6ca;
    *puVar4 = 0;
  }
  pFVar5 = callInstr->m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_0054e6ca;
    *puVar4 = 0;
  }
  bVar2 = (this_00->super_Opnd).field_0xb;
  if ((bVar2 & 2) != 0) {
    this_00 = (HelperCallOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar5);
    bVar2 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar2 | 2;
  callInstr->m_src1 = &this_00->super_Opnd;
switchD_0054e2ca_caseD_7:
  this_01 = argoutInstr->m_dst;
  if (callInstr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0054e6ca;
    *puVar4 = 0;
  }
  pFVar5 = callInstr->m_func;
  if (this_01->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_0054e6ca:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = this_01->field_0xb;
  if ((bVar2 & 2) != 0) {
    this_01 = IR::Opnd::Copy(this_01,pFVar5);
    bVar2 = this_01->field_0xb;
  }
  this_01->field_0xb = bVar2 | 2;
  callInstr->m_src2 = this_01;
  return;
}

Assistant:

void
Inline::SetupInlineInstrForCallDirect(Js::BuiltinFunction builtInId, IR::Instr* callInstr, IR::Instr* argoutInstr)
{
    switch(builtInId)
    {
    case Js::BuiltinFunction::JavascriptArray_At:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_At, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_Concat:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_Concat, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_IndexOf:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_IndexOf, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_Includes:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_Includes, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_Join:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_Join, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_LastIndexOf:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_LastIndexOf, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_Reverse:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_Reverse, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_Shift:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_Shift, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_Slice:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_Slice, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_Splice:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_Splice, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_Unshift:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_Unshift, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_At:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_At, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Concat:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Concat, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_CharCodeAt:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_CharCodeAt, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_CharAt:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_CharAt, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_FromCharCode:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_FromCharCode, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_FromCodePoint:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_FromCodePoint, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_IndexOf:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_IndexOf, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_LastIndexOf:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_LastIndexOf, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Link:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Link, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Match:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Match, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Replace:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Replace, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Search:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Search, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Slice:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Slice, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Split:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Split, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Substr:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Substr, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Substring:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Substring, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_ToLocaleLowerCase:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_ToLocaleLowerCase, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_ToLocaleUpperCase:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_ToLocaleUpperCase, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_ToLowerCase:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_ToLowerCase, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_ToUpperCase:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_ToUpperCase, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Trim:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Trim, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_TrimLeft:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_TrimLeft, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_TrimRight:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_TrimRight, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_PadStart:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_PadStart, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_PadEnd:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_PadEnd, callInstr->m_func));
        break;

    case Js::BuiltinFunction::GlobalObject_ParseInt:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperGlobalObject_ParseInt, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptRegExp_Exec:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperRegExp_Exec, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptRegExp_SymbolSearch:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperRegExp_SymbolSearch, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptObject_HasOwnProperty:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperObject_HasOwnProperty, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptObject_HasOwn:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperObject_HasOwn, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_IsArray:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_IsArray, callInstr->m_func));
        break;
    };
    callInstr->SetSrc2(argoutInstr->GetDst());
    return;
}